

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_string.c
# Opt level: O0

void test_cio_memmem(void)

{
  size_t needlelen;
  char local_1a [2];
  void *pvStack_18;
  char needle_not_found [2];
  void *found;
  char needle_found [2];
  char haystack [5];
  
  found._3_4_ = 0x64636261;
  found._7_1_ = 0;
  found._1_2_ = 0x61;
  pvStack_18 = cio_memmem((void *)((long)&found + 3),5,(void *)((long)&found + 1),1);
  UnityAssertEqualNumber
            ((UNITY_INT)pvStack_18,(long)&found + 3,"Needle was not found in haystack!",0x34,
             UNITY_DISPLAY_STYLE_INT);
  local_1a[0] = 'e';
  local_1a[1] = '\0';
  needlelen = strlen(local_1a);
  pvStack_18 = cio_memmem((void *)((long)&found + 3),5,local_1a,needlelen);
  UnityAssertEqualNumber
            (0,(UNITY_INT)pvStack_18,"Needle was found in haystack!",0x38,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_memmem(void)
{
	const char haystack[] = "abcd";
	const char needle_found[] = "a";

	const void *found = cio_memmem(haystack, sizeof(haystack), needle_found, strlen(needle_found));
	TEST_ASSERT_EQUAL_MESSAGE(found, haystack, "Needle was not found in haystack!");

	char needle_not_found[] = "e";
	found = cio_memmem(haystack, sizeof(haystack), needle_not_found, strlen(needle_not_found));
	TEST_ASSERT_EQUAL_MESSAGE(NULL, found, "Needle was found in haystack!");
}